

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

void __thiscall
QRegularExpressionPrivate::~QRegularExpressionPrivate(QRegularExpressionPrivate *this)

{
  cleanCompiledPattern(this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->pattern).d);
  return;
}

Assistant:

QRegularExpressionPrivate::~QRegularExpressionPrivate()
{
    cleanCompiledPattern();
}